

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_fontdef_type1.c
# Opt level: O3

HPDF_STATUS HPDF_Type1FontDef_SetWidths(HPDF_FontDef fontdef,HPDF_CharData *widths)

{
  HPDF_UNICODE HVar1;
  HPDF_INT16 HVar2;
  undefined4 uVar3;
  void *pvVar4;
  int iVar5;
  void *s;
  HPDF_STATUS HVar6;
  HPDF_UNICODE *pHVar7;
  long lVar8;
  
  pvVar4 = fontdef->attr;
  HPDF_FreeMem(fontdef->mmgr,*(void **)((long)pvVar4 + 8));
  *(undefined8 *)((long)pvVar4 + 8) = 0;
  fontdef->valid = 0;
  if (widths->unicode == 0xffff) {
    iVar5 = 0;
  }
  else {
    pHVar7 = &widths[1].unicode;
    iVar5 = 0;
    do {
      iVar5 = iVar5 + 1;
      HVar1 = *pHVar7;
      pHVar7 = pHVar7 + 3;
    } while (HVar1 != 0xffff);
  }
  *(int *)((long)pvVar4 + 0x10) = iVar5;
  s = HPDF_GetMem(fontdef->mmgr,iVar5 * 6);
  if (s == (void *)0x0) {
    HVar6 = HPDF_Error_GetCode(fontdef->error);
    return HVar6;
  }
  HPDF_MemSet(s,'\0',*(int *)((long)pvVar4 + 0x10) * 6);
  *(void **)((long)pvVar4 + 8) = s;
  iVar5 = *(int *)((long)pvVar4 + 0x10);
  if (iVar5 != 0) {
    lVar8 = 0;
    do {
      uVar3 = *(undefined4 *)((long)&widths->char_cd + lVar8);
      *(undefined4 *)((long)s + lVar8) = uVar3;
      HVar2 = *(HPDF_INT16 *)((long)&widths->width + lVar8);
      *(HPDF_INT16 *)((long)s + lVar8 + 4) = HVar2;
      if ((short)((uint)uVar3 >> 0x10) == 0x20) {
        fontdef->missing_width = HVar2;
      }
      lVar8 = lVar8 + 6;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  return 0;
}

Assistant:

HPDF_STATUS
HPDF_Type1FontDef_SetWidths  (HPDF_FontDef          fontdef,
                              const HPDF_CharData*  widths)
{
    const HPDF_CharData* src = widths;
    HPDF_Type1FontDefAttr attr = (HPDF_Type1FontDefAttr)fontdef->attr;
    HPDF_CharData* dst;
    HPDF_UINT i = 0;

    HPDF_PTRACE ((" HPDF_Type1FontDef_SetWidths\n"));

    FreeWidth (fontdef);

    while (src->unicode != 0xFFFF) {
        src++;
        i++;
    }

    attr->widths_count = i;

    dst = (HPDF_CharData*)HPDF_GetMem (fontdef->mmgr, sizeof(HPDF_CharData) *
            attr->widths_count);
    if (dst == NULL)
        return HPDF_Error_GetCode (fontdef->error);

    HPDF_MemSet (dst, 0, sizeof(HPDF_CharData) * attr->widths_count);
    attr->widths = dst;

    src = widths;
    for (i = 0; i < attr->widths_count; i++) {
        dst->char_cd = src->char_cd;
        dst->unicode = src->unicode;
        dst->width = src->width;
        if (dst->unicode == 0x0020) {
            fontdef->missing_width = src->width;
        }

        src++;
        dst++;
    }

    return HPDF_OK;
}